

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_pivot.cpp
# Opt level: O3

unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true> __thiscall
duckdb::Binder::BindPivot
          (Binder *this,PivotRef *ref,
          vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
          *all_columns)

{
  pointer puVar1;
  ClientContext *pCVar2;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *puVar3;
  pointer pcVar4;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var5;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var6;
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var7;
  pointer pbVar8;
  size_type sVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  InCatalogEntry *pIVar12;
  BaseExpression *pBVar13;
  undefined8 uVar14;
  undefined1 auVar15 [8];
  _Head_base<0UL,_duckdb::SelectNode_*,_false> _Var16;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var17;
  pointer prVar18;
  char cVar19;
  bool bVar20;
  int iVar21;
  pointer pPVar22;
  type pPVar23;
  idx_t iVar24;
  reference pvVar25;
  iterator iVar26;
  ClientConfig *pCVar27;
  pointer pSVar28;
  undefined8 *puVar29;
  pointer pSVar30;
  ConstantExpression *pCVar31;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var32;
  SelectNode *pSVar33;
  pointer pSVar34;
  reference pvVar35;
  TypeCatalogEntry *pTVar36;
  pointer pCVar37;
  pointer pFVar38;
  CatalogEntry *pCVar39;
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var40;
  pointer pPVar41;
  StarExpression *this_00;
  CatalogSet *pCVar42;
  reference pvVar43;
  FunctionExpression *pFVar44;
  long *plVar45;
  BinderException *pBVar46;
  __buckets_ptr in_RCX;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *puVar47
  ;
  ColumnRefExpression *pCVar48;
  ColumnRefExpression *pCVar49;
  ulong uVar50;
  _Head_base<0UL,_duckdb::DefaultGenerator_*,_false> _Var51;
  pointer pVVar52;
  Value *val;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  *pivot_name;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *puVar53
  ;
  pointer puVar54;
  size_type sVar55;
  long lVar56;
  size_type __n;
  char cVar57;
  long lVar58;
  ulong uVar59;
  unsigned_long __val;
  iterator __end1;
  uint64_t value;
  iterator __begin1;
  pointer *__x;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  *__range2;
  string enum_value;
  value_set_t pivots;
  string pivot_alias;
  string error_str;
  unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true> *pivot_node;
  vector<std::reference_wrapper<duckdb::FunctionExpression>,_true> aggregates;
  vector<std::reference_wrapper<duckdb::FunctionExpression>,_true> pivot_aggregates;
  case_insensitive_set_t handled_columns;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_360;
  CatalogEntry *local_358;
  _Head_base<0UL,_duckdb::TableRef_*,_false> local_350;
  undefined1 local_348 [64];
  optional_idx local_308;
  PivotRef *local_300;
  undefined1 local_2f8 [8];
  element_type *peStack_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  Val local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2c8;
  _Head_base<0UL,_duckdb::SelectNode_*,_false> local_2b8;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_2b0;
  CatalogEntry *local_2a8;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [8];
  undefined1 auStack_260 [8];
  undefined1 local_258 [16];
  Val local_248;
  pointer local_238;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  vStack_230;
  undefined **local_218 [2];
  _Head_base<0UL,_duckdb::DefaultGenerator_*,_false> local_208;
  _Head_base<0UL,_duckdb::CatalogEntry_*,_false> local_200;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  local_1f8;
  vector<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_> local_1d8;
  _Head_base<0UL,_duckdb::CatalogEntry_*,_false> local_1c0;
  vector<std::reference_wrapper<duckdb::FunctionExpression>,_true> local_1b8;
  __buckets_ptr local_1a0;
  vector<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_> local_198;
  vector<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_> local_178;
  ClientContext *local_160;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  local_158;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_d8;
  string local_a0;
  string local_80;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> local_60 [24];
  LogicalType local_48;
  
  local_d8._M_buckets = &local_d8._M_single_bucket;
  local_d8._M_bucket_count = 1;
  local_d8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_d8._M_element_count = 0;
  local_d8._M_rehash_policy._M_max_load_factor = 1.0;
  local_d8._M_rehash_policy._M_next_resize = 0;
  local_d8._M_single_bucket = (__node_base_ptr)0x0;
  local_1b8.
  super_vector<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.
  super_vector<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8.
  super_vector<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar54 = all_columns[4].
            super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
  puVar1 = all_columns[5].
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_300 = (PivotRef *)all_columns;
  local_218[1] = (undefined **)this;
  local_208._M_head_impl = (DefaultGenerator *)ref;
  local_1a0 = in_RCX;
  if (puVar54 != puVar1) {
    do {
      pPVar22 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator->(puVar54);
      iVar21 = (*(pPVar22->super_BaseExpression)._vptr_BaseExpression[4])(pPVar22);
      if ((char)iVar21 != '\0') {
        pBVar46 = (BinderException *)__cxa_allocate_exception(0x10);
        pPVar23 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator*(puVar54);
        local_278._0_8_ = local_268;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_278,"Pivot expression cannot contain subqueries","");
        BinderException::BinderException<>(pBVar46,pPVar23,(string *)local_278);
        __cxa_throw(pBVar46,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pPVar22 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator->(puVar54);
      iVar21 = (*(pPVar22->super_BaseExpression)._vptr_BaseExpression[3])(pPVar22);
      if ((char)iVar21 != '\0') {
        pBVar46 = (BinderException *)__cxa_allocate_exception(0x10);
        pPVar23 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator*(puVar54);
        local_278._0_8_ = local_268;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_278,"Pivot expression cannot contain window functions","");
        BinderException::BinderException<>(pBVar46,pPVar23,(string *)local_278);
        __cxa_throw(pBVar46,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      lVar56 = (long)local_1b8.
                     super_vector<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
                     .
                     super__Vector_base<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_1b8.
                     super_vector<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
                     .
                     super__Vector_base<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      pCVar2 = (ClientContext *)
               (((string *)&(local_208._M_head_impl)->created_all_entries)->_M_dataplus)._M_p;
      pPVar23 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator*(puVar54);
      ExtractPivotAggregateExpression(pCVar2,pPVar23,&local_1b8);
      prVar18 = local_1b8.
                super_vector<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
                .
                super__Vector_base<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      lVar56 = lVar56 >> 3;
      lVar58 = (long)local_1b8.
                     super_vector<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
                     .
                     super__Vector_base<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_1b8.
                     super_vector<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
                     .
                     super__Vector_base<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3;
      if (lVar58 != lVar56 + 1) {
        __val = lVar58 - lVar56;
        if (__val == 0) {
          local_278._0_8_ = local_268;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_278,"but no aggregates were found","");
        }
        else {
          std::__cxx11::to_string((string *)local_2f8,__val);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_348,"but ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_2f8);
          plVar45 = (long *)::std::__cxx11::string::append(local_348);
          local_278._0_8_ = *plVar45;
          pVVar52 = (pointer)(plVar45 + 2);
          if ((pointer)local_278._0_8_ == pVVar52) {
            local_268 = (pVVar52->type_).id_;
            auStack_260 = (undefined1  [8])plVar45[3];
            local_278._0_8_ = (pointer)local_268;
          }
          else {
            local_268 = (pVVar52->type_).id_;
          }
          local_278._8_8_ = plVar45[1];
          *plVar45 = (long)pVVar52;
          plVar45[1] = 0;
          *(undefined1 *)(plVar45 + 2) = 0;
          if ((ColumnRefExpression *)local_348._0_8_ != (ColumnRefExpression *)(local_348 + 0x10)) {
            operator_delete((void *)local_348._0_8_);
          }
          if (local_2f8 != (undefined1  [8])&local_2e8) {
            operator_delete((void *)local_2f8);
          }
        }
        pBVar46 = (BinderException *)__cxa_allocate_exception(0x10);
        pPVar23 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator*(puVar54);
        local_348._0_8_ = local_348 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_348,"Pivot expression must contain exactly one aggregate, %s","")
        ;
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f8,local_278._0_8_,
                   (pointer)((long)&((LogicalType *)local_278._8_8_)->id_ + local_278._0_8_));
        BinderException::BinderException<std::__cxx11::string>
                  (pBVar46,pPVar23,(string *)local_348,&local_f8);
        __cxa_throw(pBVar46,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      puVar54 = puVar54 + 1;
    } while (puVar54 != puVar1);
    if (local_1b8.
        super_vector<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
        .
        super__Vector_base<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_1b8.
        super_vector<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
        .
        super__Vector_base<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pCVar39 = (CatalogEntry *)
                local_1b8.
                super_vector<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
                .
                super__Vector_base<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        ExtractPivotExpressions
                  ((ParsedExpression *)pCVar39->_vptr_CatalogEntry,
                   (case_insensitive_set_t *)&local_d8);
        pCVar39 = (CatalogEntry *)&pCVar39->oid;
      } while (pCVar39 != (CatalogEntry *)prVar18);
    }
  }
  pCVar39 = (CatalogEntry *)
            (local_300->pivots).
            super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
            super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_1c0._M_head_impl =
       (CatalogEntry *)
       (local_300->pivots).super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
       super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (pCVar39 == local_1c0._M_head_impl) {
    local_350._M_head_impl = (TableRef *)&DAT_00000001;
  }
  else {
    local_350._M_head_impl = (TableRef *)&DAT_00000001;
    do {
      lVar56._0_1_ = (pCVar39->comment).type_.id_;
      lVar56._1_1_ = (pCVar39->comment).type_.physical_type_;
      lVar56._2_6_ = *(undefined6 *)&(pCVar39->comment).type_.field_0x2;
      local_358 = pCVar39;
      if (lVar56 != 0) {
        pCVar2 = (ClientContext *)
                 (((string *)((long)local_208._M_head_impl + 0x10))->_M_dataplus)._M_p;
        local_278._0_8_ = local_268;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_278,anon_var_dwarf_63f17de + 9,anon_var_dwarf_63f17de + 9);
        local_348._0_8_ = local_348 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_348,anon_var_dwarf_63f17de + 9,anon_var_dwarf_63f17de + 9);
        local_2f8 = (undefined1  [8])
                    Catalog::GetEntry<duckdb::TypeCatalogEntry>
                              (pCVar2,(string *)local_278,(string *)local_348,
                               (string *)&pCVar39->timestamp,THROW_EXCEPTION,
                               (QueryErrorContext)0xffffffffffffffff);
        optional_ptr<duckdb::TypeCatalogEntry,_true>::CheckValid
                  ((optional_ptr<duckdb::TypeCatalogEntry,_true> *)local_2f8);
        auVar15 = local_2f8;
        if ((ColumnRefExpression *)local_348._0_8_ != (ColumnRefExpression *)(local_348 + 0x10)) {
          operator_delete((void *)local_348._0_8_);
        }
        if ((pointer)local_278._0_8_ != (pointer)local_268) {
          operator_delete((void *)local_278._0_8_);
        }
        LogicalType::LogicalType((LogicalType *)local_2f8,(LogicalType *)((long)auVar15 + 0x120));
        if (local_2f8[0] != (duckdb)0x68) {
          pBVar46 = (BinderException *)__cxa_allocate_exception(0x10);
          local_278._0_8_ = local_268;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_278,
                     "Pivot must reference an ENUM type: \"%s\" is of type \"%s\"","");
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    (((string *)&local_358->timestamp)->_M_dataplus)._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_118,p_Var10,
                     (long)&p_Var10->_vptr__Sp_counted_base + *(long *)&(local_358->comment).type_);
          LogicalType::ToString_abi_cxx11_(&local_80,(LogicalType *)local_2f8);
          BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
                    (pBVar46,&local_300->super_TableRef,(string *)local_278,&local_118,&local_80);
          __cxa_throw(pBVar46,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        bVar20 = LogicalType::IsComplete((LogicalType *)local_2f8);
        if (!bVar20) {
          pBVar46 = (BinderException *)__cxa_allocate_exception(0x10);
          local_278._0_8_ = local_268;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_278,"ENUM type is incomplete","");
          BinderException::BinderException(pBVar46,(string *)local_278);
          __cxa_throw(pBVar46,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        iVar24 = EnumType::GetSize((LogicalType *)local_2f8);
        if (iVar24 != 0) {
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)&local_358->name;
          value = 0;
          do {
            Value::ENUM((Value *)local_278,value,(LogicalType *)local_2f8);
            EnumType::GetValue_abi_cxx11_((string *)local_348,(EnumType *)local_278,val);
            Value::~Value((Value *)local_278);
            local_268 = (undefined1  [8])0x0;
            auStack_260 = (undefined1  [8])0x0;
            local_278._0_8_ = (pointer)0x0;
            local_278._8_8_ = (CatalogSet *)0x0;
            local_258._0_8_ = &local_248;
            local_258._8_8_ = 0;
            local_248.ubigint = local_248.ubigint & 0xffffffffffffff00;
            ::std::vector<duckdb::Value,std::allocator<duckdb::Value>>::
            emplace_back<std::__cxx11::string&>
                      ((vector<duckdb::Value,std::allocator<duckdb::Value>> *)local_278,
                       (string *)local_348);
            ::std::__cxx11::string::operator=((string *)local_258,(string *)local_348);
            ::std::vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>::
            emplace_back<duckdb::PivotColumnEntry>
                      ((vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
                        *)(paVar11->_M_local_buf + 0x10),(PivotColumnEntry *)local_278);
            if ((Val *)local_258._0_8_ != &local_248) {
              operator_delete((void *)local_258._0_8_);
            }
            if (auStack_260 != (undefined1  [8])0x0) {
              (**(code **)(*(long *)auStack_260 + 8))();
            }
            auStack_260 = (undefined1  [8])0x0;
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                      ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)local_278);
            if ((ColumnRefExpression *)local_348._0_8_ != (ColumnRefExpression *)(local_348 + 0x10))
            {
              operator_delete((void *)local_348._0_8_);
            }
            value = value + 1;
          } while (iVar24 != value);
        }
        LogicalType::~LogicalType((LogicalType *)local_2f8);
      }
      puVar47 = *(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  **)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)&local_358->name)->_M_local_buf + 0x18);
      local_218[0] = (undefined **)
                     ((long)puVar47 -
                     *(long *)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)&local_358->name)->_M_local_buf + 0x10));
      puVar53 = (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 *)((TableRef *)&local_358->_vptr_CatalogEntry)->_vptr_TableRef;
      puVar3 = (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)local_358->oid;
      if (puVar53 != puVar3) {
        do {
          pPVar23 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    ::operator*(puVar53);
          ExtractPivotExpressions(pPVar23,(case_insensitive_set_t *)&local_d8);
          puVar53 = puVar53 + 1;
        } while (puVar53 != puVar3);
        puVar47 = *(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    **)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)&local_358->name)->_M_local_buf + 0x18);
      }
      local_2f8 = (undefined1  [8])&aStack_2c8;
      peStack_2f0 = (element_type *)&DAT_00000001;
      local_2e8._M_allocated_capacity = 0;
      local_2e8._8_8_ = 0;
      local_2d8.integer = 0x3f800000;
      local_2d8.hugeint.upper = 0;
      aStack_2c8._M_allocated_capacity = 0;
      __x = *(pointer **)
             (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)&local_358->name)->_M_local_buf + 0x10);
      local_2a8 = (CatalogEntry *)puVar47;
      if ((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           *)__x != puVar47) {
        do {
          LogicalType::LogicalType(&local_48,SQLNULL);
          Value::Value((Value *)local_278,&local_48);
          LogicalType::~LogicalType(&local_48);
          if ((long)__x[1] - (long)*__x == 0x40) {
            pvVar25 = vector<duckdb::Value,_true>::operator[]((vector<duckdb::Value,_true> *)__x,0);
            Value::operator=((Value *)local_278,pvVar25);
          }
          else {
            LogicalType::LogicalType((LogicalType *)&local_298,VARCHAR);
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
                      (local_60,(vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)__x);
            Value::LIST((Value *)local_348,(LogicalType *)&local_298,
                        (vector<duckdb::Value,_true> *)local_60);
            Value::operator=((Value *)local_278,(Value *)local_348);
            Value::~Value((Value *)local_348);
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector(local_60);
            LogicalType::~LogicalType((LogicalType *)&local_298);
          }
          iVar26 = ::std::
                   _Hashtable<duckdb::Value,_duckdb::Value,_std::allocator<duckdb::Value>,_std::__detail::_Identity,_duckdb::ValueEquality,_duckdb::ValueHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   ::find((_Hashtable<duckdb::Value,_duckdb::Value,_std::allocator<duckdb::Value>,_std::__detail::_Identity,_duckdb::ValueEquality,_duckdb::ValueHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                           *)local_2f8,(Value *)local_278);
          if (iVar26.super__Node_iterator_base<duckdb::Value,_true>._M_cur != (__node_type *)0x0) {
            pBVar46 = (BinderException *)__cxa_allocate_exception(0x10);
            local_348._0_8_ = local_348 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_348,
                       "The value \"%s\" was specified multiple times in the IN clause","");
            Value::ToString_abi_cxx11_(&local_a0,(Value *)local_278);
            BinderException::BinderException<std::__cxx11::string>
                      (pBVar46,&local_300->super_TableRef,(string *)local_348,&local_a0);
            __cxa_throw(pBVar46,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
          }
          if ((long)__x[1] - (long)*__x >> 6 !=
              (long)local_358->oid -
              (long)((TableRef *)&local_358->_vptr_CatalogEntry)->_vptr_TableRef >> 3) {
            pBVar46 = (BinderException *)__cxa_allocate_exception(0x10);
            local_348._0_8_ = local_348 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_348,
                       "PIVOT IN list - inconsistent amount of rows - expected %d but got %d","");
            BinderException::BinderException<unsigned_long,unsigned_long>
                      (pBVar46,&local_300->super_TableRef,(string *)local_348,
                       (long)local_358->oid -
                       (long)((TableRef *)&local_358->_vptr_CatalogEntry)->_vptr_TableRef >> 3,
                       (long)__x[1] - (long)*__x >> 6);
            __cxa_throw(pBVar46,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
          }
          local_348._0_8_ = (ColumnRefExpression *)local_2f8;
          ::std::
          _Hashtable<duckdb::Value,duckdb::Value,std::allocator<duckdb::Value>,std::__detail::_Identity,duckdb::ValueEquality,duckdb::ValueHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::
          _M_insert<duckdb::Value_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::Value,true>>>>
                    ((_Hashtable<duckdb::Value,duckdb::Value,std::allocator<duckdb::Value>,std::__detail::_Identity,duckdb::ValueEquality,duckdb::ValueHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)local_2f8,(Value *)local_278,local_348);
          Value::~Value((Value *)local_278);
          __x = __x + 8;
        } while ((CatalogEntry *)__x != local_2a8);
      }
      local_350._M_head_impl = local_350._M_head_impl * ((long)local_218[0] >> 6);
      ::std::
      _Hashtable<duckdb::Value,_duckdb::Value,_std::allocator<duckdb::Value>,_std::__detail::_Identity,_duckdb::ValueEquality,_duckdb::ValueHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable((_Hashtable<duckdb::Value,_duckdb::Value,_std::allocator<duckdb::Value>,_std::__detail::_Identity,_duckdb::ValueEquality,_duckdb::ValueHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)local_2f8);
      pCVar39 = (CatalogEntry *)&(local_358->comment).value_;
    } while (pCVar39 != local_1c0._M_head_impl);
  }
  pCVar27 = ClientConfig::GetConfig
                      ((ClientContext *)
                       (((string *)((long)local_208._M_head_impl + 0x10))->_M_dataplus)._M_p);
  if ((CatalogEntry *)pCVar27->pivot_limit <= local_350._M_head_impl) {
    pBVar46 = (BinderException *)__cxa_allocate_exception(0x10);
    local_278._0_8_ = local_268;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_278,
               "Pivot column limit of %llu exceeded. Use SET pivot_limit=X to increase the limit.",
               "");
    BinderException::BinderException<unsigned_long>
              (pBVar46,&local_300->super_TableRef,(string *)local_278,pCVar27->pivot_limit);
    __cxa_throw(pBVar46,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  local_1d8.
  super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.
  super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.
  super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_268 = (undefined1  [8])0x0;
  local_258._0_8_ = 0;
  local_248.bigint = 0;
  local_278._0_8_ = (CatalogSet *)0x0;
  local_278._8_8_ = (CatalogSet *)0x0;
  local_258._8_8_ = 0;
  auStack_260 = (undefined1  [8])(local_258 + 8);
  ConstructPivots(local_300,(vector<duckdb::PivotValueElement,_true> *)&local_1d8,0,
                  (PivotValueElement *)local_278);
  if (auStack_260 != (undefined1  [8])(local_258 + 8)) {
    operator_delete((void *)auStack_260);
  }
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)local_278);
  *local_218[1] = (undefined *)0x0;
  uVar59 = ((long)local_1d8.
                  super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_1d8.
                  super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
  if (uVar59 < pCVar27->pivot_filter_threshold || uVar59 - pCVar27->pivot_filter_threshold == 0) {
    pCVar2 = (ClientContext *)
             (((string *)&(local_208._M_head_impl)->created_all_entries)->_M_dataplus)._M_p;
    local_288._0_8_ = local_1a0[2];
    local_298._M_allocated_capacity = (size_type)*local_1a0;
    local_298._8_8_ = local_1a0[1];
    *local_1a0 = (__node_base_ptr)0x0;
    local_1a0[1] = (__node_base_ptr)0x0;
    local_1a0[2] = (__node_base_ptr)0x0;
    local_178.
    super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_1d8.
         super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_178.
    super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_1d8.
         super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_178.
    super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_1d8.
         super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_1d8.
    super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d8.
    super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1d8.
    super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_138.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_138.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_138.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ConstructInitialGrouping
              ((duckdb *)&local_2b0,local_300,
               (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                *)&local_298,(case_insensitive_set_t *)&local_d8);
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               *)&local_298);
    local_2a8 = (CatalogEntry *)
                local_178.
                super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_1c0._M_head_impl =
         (CatalogEntry *)
         local_178.
         super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (local_178.
        super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_178.
        super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      local_160 = pCVar2;
      do {
        local_360._M_head_impl = (ParsedExpression *)0x0;
        _Var51._M_head_impl =
             (DefaultGenerator *)
             (local_300->pivots).
             super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
             super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_208._M_head_impl =
             (DefaultGenerator *)
             (local_300->pivots).
             super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
             super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (_Var51._M_head_impl != local_208._M_head_impl) {
          __n = 0;
          do {
            pCVar39 = *(CatalogEntry **)_Var51._M_head_impl;
            local_350._M_head_impl = *(TableRef **)((long)_Var51._M_head_impl + 8);
            local_218[0] = (undefined **)_Var51._M_head_impl;
            if (pCVar39 != (CatalogEntry *)local_350._M_head_impl) {
              do {
                pPVar22 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                          ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                        *)pCVar39);
                (*(pPVar22->super_BaseExpression)._vptr_BaseExpression[0xc])(local_2f8,pPVar22);
                pCVar42 = (CatalogSet *)operator_new(0x60);
                LogicalType::LogicalType((LogicalType *)local_278,VARCHAR);
                local_348._0_8_ = local_2f8;
                local_2f8 = (undefined1  [8])0x0;
                CastExpression::CastExpression
                          ((CastExpression *)pCVar42,(LogicalType *)local_278,
                           (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                            *)local_348,false);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_348._0_8_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  (**(code **)(*(size_type *)local_348._0_8_ + 8))();
                }
                local_348._0_8_ = (pointer)0x0;
                LogicalType::~LogicalType((LogicalType *)local_278);
                if (local_2f8 != (undefined1  [8])0x0) {
                  (**(code **)(*(size_type *)local_2f8 + 8))();
                }
                pvVar25 = vector<duckdb::Value,_true>::operator[]
                                    ((vector<duckdb::Value,_true> *)local_2a8,__n);
                LogicalType::LogicalType((LogicalType *)local_2f8,VARCHAR);
                Value::DefaultCastAs((Value *)local_348,pvVar25,(LogicalType *)local_2f8,false);
                pCVar31 = (ConstantExpression *)operator_new(0x78);
                local_358 = pCVar39;
                Value::Value((Value *)local_278,(Value *)local_348);
                ConstantExpression::ConstantExpression(pCVar31,(Value *)local_278);
                Value::~Value((Value *)local_278);
                Value::~Value((Value *)local_348);
                LogicalType::~LogicalType((LogicalType *)local_2f8);
                _Var32._M_head_impl = (ParsedExpression *)operator_new(0x48);
                local_348._0_8_ = pCVar31;
                local_278._0_8_ = pCVar42;
                ComparisonExpression::ComparisonExpression
                          ((ComparisonExpression *)_Var32._M_head_impl,COMPARE_BOUNDARY_END,
                           (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                            *)local_278,
                           (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                            *)local_348);
                if ((ConstantExpression *)local_348._0_8_ != (ConstantExpression *)0x0) {
                  (**(code **)(*(long *)local_348._0_8_ + 8))();
                }
                local_348._0_8_ = (ColumnRefExpression *)0x0;
                if ((CatalogSet *)local_278._0_8_ != (CatalogSet *)0x0) {
                  (**(code **)(*(long *)local_278._0_8_ + 8))();
                }
                pCVar39 = local_358;
                _Var5._M_head_impl = local_360._M_head_impl;
                if ((CatalogSet *)local_360._M_head_impl != (CatalogSet *)0x0) {
                  pCVar42 = (CatalogSet *)operator_new(0x50);
                  local_278._0_8_ = _Var5._M_head_impl;
                  local_360._M_head_impl = (ParsedExpression *)0x0;
                  local_348._0_8_ = _Var32._M_head_impl;
                  ConjunctionExpression::ConjunctionExpression
                            ((ConjunctionExpression *)pCVar42,CONJUNCTION_AND,
                             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                              *)local_278,
                             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                              *)local_348);
                  if ((CastExpression *)local_348._0_8_ != (CastExpression *)0x0) {
                    (**(code **)(*(long *)local_348._0_8_ + 8))();
                  }
                  local_348._0_8_ = (ColumnRefExpression *)0x0;
                  if ((CatalogSet *)local_278._0_8_ != (CatalogSet *)0x0) {
                    (**(code **)(*(long *)local_278._0_8_ + 8))();
                  }
                  _Var32._M_head_impl = (ParsedExpression *)pCVar42;
                  if (local_360._M_head_impl != (ParsedExpression *)0x0) {
                    pBVar13 = &(local_360._M_head_impl)->super_BaseExpression;
                    local_360._M_head_impl = (ParsedExpression *)pCVar42;
                    (*pBVar13->_vptr_BaseExpression[1])();
                    _Var32._M_head_impl = local_360._M_head_impl;
                  }
                }
                local_360._M_head_impl = _Var32._M_head_impl;
                pCVar39 = (CatalogEntry *)&pCVar39->oid;
                __n = __n + 1;
              } while (pCVar39 != (CatalogEntry *)local_350._M_head_impl);
            }
            _Var51._M_head_impl = (DefaultGenerator *)((long)local_218[0] + 0x70);
          } while (_Var51._M_head_impl != local_208._M_head_impl);
        }
        pCVar2 = local_160;
        puVar53 = (local_300->aggregates).
                  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (puVar47 = (local_300->aggregates).
                       super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; puVar47 != puVar53;
            puVar47 = puVar47 + 1) {
          pPVar22 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    ::operator->(puVar47);
          (*(pPVar22->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_308,pPVar22);
          local_1f8.
          super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_1f8.
          super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1f8.
          super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pPVar23 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    ::operator*((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                 *)&local_308);
          ExtractPivotAggregateExpression
                    (pCVar2,pPVar23,
                     (vector<std::reference_wrapper<duckdb::FunctionExpression>,_true> *)&local_1f8)
          ;
          pvVar43 = vector<std::reference_wrapper<duckdb::FunctionExpression>,_true>::operator[]
                              ((vector<std::reference_wrapper<duckdb::FunctionExpression>,_true> *)
                               &local_1f8,0);
          pFVar44 = BaseExpression::Cast<duckdb::FunctionExpression>
                              ((BaseExpression *)pvVar43->_M_data);
          pPVar22 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                  *)&local_360);
          (*(pPVar22->super_BaseExpression)._vptr_BaseExpression[0xc])((Value *)local_278,pPVar22);
          uVar14 = local_278._0_8_;
          local_278._0_8_ = (pointer)0x0;
          _Var32._M_head_impl =
               (pFVar44->filter).
               super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
               .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
          (pFVar44->filter).
          super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
               (ParsedExpression *)uVar14;
          if ((_Var32._M_head_impl != (ParsedExpression *)0x0) &&
             ((**(code **)(*(long *)&(_Var32._M_head_impl)->super_BaseExpression + 8))(),
             (pointer)local_278._0_8_ != (pointer)0x0)) {
            (**(code **)(*(long *)local_278._0_8_ + 8))();
          }
          pPVar22 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    ::operator->(puVar47);
          pbVar8 = (((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      *)&local_2a8->set)->
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_278._0_8_ = (CatalogSet *)local_268;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_278,pbVar8,
                     (long)&(pbVar8->_M_dataplus)._M_p +
                     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)&local_2a8->name)->_M_allocated_capacity);
          sVar9 = (pPVar22->super_BaseExpression).alias._M_string_length;
          if ((ulong)((long)(local_300->aggregates).
                            super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                            .
                            super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(local_300->aggregates).
                           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                           .
                           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) < 9) {
            if (sVar9 != 0) goto LAB_0070914e;
          }
          else {
            if (sVar9 == 0) {
              pPVar22 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                        ::operator->(puVar47);
              (*(pPVar22->super_BaseExpression)._vptr_BaseExpression[7])(local_2f8,pPVar22);
            }
            else {
LAB_0070914e:
              local_2f8 = (undefined1  [8])&local_2e8;
              pcVar4 = (pPVar22->super_BaseExpression).alias._M_dataplus._M_p;
              ::std::__cxx11::string::_M_construct<char*>((string *)local_2f8,pcVar4,pcVar4 + sVar9)
              ;
            }
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_348,"_",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_2f8);
            ::std::__cxx11::string::_M_append((char *)local_278,local_348._0_8_);
            if ((ColumnRefExpression *)local_348._0_8_ != (ColumnRefExpression *)(local_348 + 0x10))
            {
              operator_delete((void *)local_348._0_8_);
            }
            if (local_2f8 != (undefined1  [8])&local_2e8) {
              operator_delete((void *)local_2f8);
            }
          }
          pPVar22 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                  *)&local_308);
          ::std::__cxx11::string::_M_assign((string *)&(pPVar22->super_BaseExpression).alias);
          pSVar28 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
                    operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                                *)&local_2b0);
          ::std::
          vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                      *)&pSVar28->select_list,
                     (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *)&local_308);
          if ((CatalogSet *)local_278._0_8_ != (CatalogSet *)local_268) {
            operator_delete((void *)local_278._0_8_);
          }
          if ((StarExpression *)
              local_1f8.
              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (StarExpression *)0x0) {
            operator_delete(local_1f8.
                            super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          if ((ColumnRefExpression *)local_308.index != (ColumnRefExpression *)0x0) {
            (**(code **)(*(long *)local_308.index + 8))();
          }
        }
        if ((CatalogSet *)local_360._M_head_impl != (CatalogSet *)0x0) {
          (*(((ParsedExpression *)&((CatalogSet *)local_360._M_head_impl)->catalog)->
            super_BaseExpression)._vptr_BaseExpression[1])();
        }
        local_2a8 = (CatalogEntry *)
                    (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)&local_2a8->name)->_M_local_buf + 0x18);
      } while (local_2a8 != local_1c0._M_head_impl);
    }
    *local_218[1] = (undefined *)local_2b0._M_head_impl;
    local_2b0._M_head_impl = (ParsedExpression *)0x0;
    ::std::vector<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>::~vector
              (&local_178);
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ::~vector(&local_138);
  }
  else {
    vStack_230.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_230.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_238 = (pointer)0x0;
    vStack_230.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_248.bigint = 0;
    local_248.hugeint.upper = 0;
    local_258._0_8_ = (pointer)0x0;
    local_258._8_8_ = (pointer)0x0;
    local_268 = (undefined1  [8])0x0;
    auStack_260 = (undefined1  [8])0x0;
    local_278._0_8_ = (CatalogSet *)0x0;
    local_278._8_8_ = (CatalogSet *)0x0;
    local_1f8.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_1a0[2];
    local_1f8.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)*local_1a0;
    local_1f8.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_1a0[1];
    *local_1a0 = (__node_base_ptr)0x0;
    local_1a0[1] = (__node_base_ptr)0x0;
    local_1a0[2] = (__node_base_ptr)0x0;
    local_158.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_158.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_158.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ConstructInitialGrouping
              ((duckdb *)&local_2b8,local_300,
               (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                *)&local_1f8,(case_insensitive_set_t *)&local_d8);
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ::~vector(&local_1f8);
    pSVar28 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
              operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                          *)&local_2b8);
    puVar54 = (pSVar28->select_list).
              super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = (pSVar28->select_list).
             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar54 != puVar1) {
      pCVar49 = (ColumnRefExpression *)(local_348 + 0x10);
      local_358 = (CatalogEntry *)0x0;
      do {
        pPVar22 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator->(puVar54);
        (*(pPVar22->super_BaseExpression)._vptr_BaseExpression[7])
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348,
                   pPVar22);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   (local_268 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348);
        if ((ColumnRefExpression *)local_348._0_8_ != pCVar49) {
          operator_delete((void *)local_348._0_8_);
        }
        pPVar22 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator->(puVar54);
        if ((pPVar22->super_BaseExpression).alias._M_string_length == 0) {
          pPVar22 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    ::operator->(puVar54);
          local_358 = (CatalogEntry *)
                      ((long)&((TableRef *)&local_358->_vptr_CatalogEntry)->_vptr_TableRef + 1);
          cVar57 = '\x01';
          if ((CatalogEntry *)0x9 < local_358) {
            pCVar39 = local_358;
            cVar19 = '\x04';
            do {
              cVar57 = cVar19;
              if (pCVar39 < (CatalogEntry *)0x64) {
                cVar57 = cVar57 + -2;
                goto LAB_00707ab7;
              }
              if (pCVar39 < (CatalogEntry *)0x3e8) {
                cVar57 = cVar57 + -1;
                goto LAB_00707ab7;
              }
              if (pCVar39 < (CatalogEntry *)0x2710) goto LAB_00707ab7;
              bVar20 = (CatalogEntry *)0x1869f < pCVar39;
              pCVar39 = (CatalogEntry *)((ulong)pCVar39 / 10000);
              cVar19 = cVar57 + '\x04';
            } while (bVar20);
            cVar57 = cVar57 + '\x01';
          }
LAB_00707ab7:
          local_2f8 = (undefined1  [8])&local_2e8;
          ::std::__cxx11::string::_M_construct((ulong)local_2f8,cVar57);
          ::std::__detail::__to_chars_10_impl<unsigned_long>
                    ((char *)local_2f8,(uint)peStack_2f0,(unsigned_long)local_358);
          puVar29 = (undefined8 *)
                    ::std::__cxx11::string::replace((ulong)local_2f8,0,(char *)0x0,0x136131d);
          pCVar48 = (ColumnRefExpression *)(puVar29 + 2);
          if ((ColumnRefExpression *)*puVar29 == pCVar48) {
            local_348._16_8_ =
                 (pCVar48->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression;
            local_348._24_8_ = puVar29[3];
            local_348._0_8_ = pCVar49;
          }
          else {
            local_348._16_8_ =
                 (pCVar48->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression;
            local_348._0_8_ = (ColumnRefExpression *)*puVar29;
          }
          local_348._8_8_ = puVar29[1];
          *puVar29 = pCVar48;
          puVar29[1] = 0;
          *(undefined1 *)(puVar29 + 2) = 0;
          ::std::__cxx11::string::operator=
                    ((string *)&(pPVar22->super_BaseExpression).alias,(string *)local_348);
          if ((ColumnRefExpression *)local_348._0_8_ != pCVar49) {
            operator_delete((void *)local_348._0_8_);
          }
          if (local_2f8 != (undefined1  [8])&local_2e8) {
            operator_delete((void *)local_2f8);
          }
        }
        pPVar22 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator->(puVar54);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_278,&(pPVar22->super_BaseExpression).alias);
        puVar54 = puVar54 + 1;
      } while (puVar54 != puVar1);
    }
    pCVar39 = (CatalogEntry *)
              (local_300->pivots).
              super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
              super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_218[0] = (undefined **)
                   (local_300->pivots).
                   super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
                   super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
    if (pCVar39 != (CatalogEntry *)local_218[0]) {
      local_358 = (CatalogEntry *)0x0;
      do {
        puVar47 = (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   *)((TableRef *)&pCVar39->_vptr_CatalogEntry)->_vptr_TableRef;
        local_2a8 = (CatalogEntry *)pCVar39->oid;
        local_350._M_head_impl = (TableRef *)pCVar39;
        if ((CatalogEntry *)puVar47 != local_2a8) {
          do {
            pPVar22 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      ::operator->(puVar47);
            if ((pPVar22->super_BaseExpression).alias._M_string_length == 0) {
              pPVar22 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                        ::operator->(puVar47);
              local_358 = (CatalogEntry *)
                          ((long)&((TableRef *)&local_358->_vptr_CatalogEntry)->_vptr_TableRef + 1);
              cVar57 = '\x01';
              if ((CatalogEntry *)0x9 < local_358) {
                pCVar39 = local_358;
                cVar19 = '\x04';
                do {
                  cVar57 = cVar19;
                  if (pCVar39 < (CatalogEntry *)0x64) {
                    cVar57 = cVar57 + -2;
                    goto LAB_00707c99;
                  }
                  if (pCVar39 < (CatalogEntry *)0x3e8) {
                    cVar57 = cVar57 + -1;
                    goto LAB_00707c99;
                  }
                  if (pCVar39 < (CatalogEntry *)0x2710) goto LAB_00707c99;
                  bVar20 = (CatalogEntry *)0x1869f < pCVar39;
                  pCVar39 = (CatalogEntry *)((ulong)pCVar39 / 10000);
                  cVar19 = cVar57 + '\x04';
                } while (bVar20);
                cVar57 = cVar57 + '\x01';
              }
LAB_00707c99:
              local_2f8 = (undefined1  [8])&local_2e8;
              ::std::__cxx11::string::_M_construct((ulong)local_2f8,cVar57);
              ::std::__detail::__to_chars_10_impl<unsigned_long>
                        ((char *)local_2f8,(uint)peStack_2f0,(unsigned_long)local_358);
              puVar29 = (undefined8 *)
                        ::std::__cxx11::string::replace((ulong)local_2f8,0,(char *)0x0,0x1361334);
              pCVar49 = (ColumnRefExpression *)(puVar29 + 2);
              if ((ColumnRefExpression *)*puVar29 == pCVar49) {
                local_348._16_8_ =
                     (pCVar49->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression;
                local_348._24_8_ = puVar29[3];
                local_348._0_8_ = (ColumnRefExpression *)(local_348 + 0x10);
              }
              else {
                local_348._16_8_ =
                     (pCVar49->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression;
                local_348._0_8_ = (ColumnRefExpression *)*puVar29;
              }
              local_348._8_8_ = puVar29[1];
              *puVar29 = pCVar49;
              puVar29[1] = 0;
              *(undefined1 *)(puVar29 + 2) = 0;
              ::std::__cxx11::string::operator=
                        ((string *)&(pPVar22->super_BaseExpression).alias,(string *)local_348);
              if ((ColumnRefExpression *)local_348._0_8_ !=
                  (ColumnRefExpression *)(local_348 + 0x10)) {
                operator_delete((void *)local_348._0_8_);
              }
              if (local_2f8 != (undefined1  [8])&local_2e8) {
                operator_delete((void *)local_2f8);
              }
            }
            pPVar22 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      ::operator->(puVar47);
            pcVar4 = (pPVar22->super_BaseExpression).alias._M_dataplus._M_p;
            local_298._M_allocated_capacity = (size_type)(TypeCatalogEntry *)local_288;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_298,pcVar4,
                       pcVar4 + (pPVar22->super_BaseExpression).alias._M_string_length);
            pSVar28 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                      ::operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                                    *)&local_2b8);
            pSVar30 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                      ::operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                                    *)&local_2b8);
            Value::INTEGER((Value *)local_2f8,
                           (int)((ulong)((long)(pSVar30->select_list).
                                               super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                               .
                                               super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)(pSVar30->select_list).
                                              super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                              .
                                              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 3) + 1);
            pCVar31 = (ConstantExpression *)operator_new(0x78);
            Value::Value((Value *)local_348,(Value *)local_2f8);
            ConstantExpression::ConstantExpression(pCVar31,(Value *)local_348);
            Value::~Value((Value *)local_348);
            local_360._M_head_impl = (ParsedExpression *)pCVar31;
            ::std::
            vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                        *)&pSVar28->groups,
                       (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                        *)&local_360);
            if ((ConstantExpression *)local_360._M_head_impl != (ConstantExpression *)0x0) {
              (*((BaseExpression *)
                &((local_360._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)->
                _vptr_BaseExpression[1])();
            }
            local_360._M_head_impl = (ParsedExpression *)0x0;
            Value::~Value((Value *)local_2f8);
            pSVar28 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                      ::operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                                    *)&local_2b8);
            ::std::
            vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                        *)&pSVar28->select_list,puVar47);
            _Var32._M_head_impl = (ParsedExpression *)operator_new(0x50);
            local_348._0_8_ = local_348 + 0x10;
            if ((TypeCatalogEntry *)local_298._M_allocated_capacity == (TypeCatalogEntry *)local_288
               ) {
              local_348._24_8_ = local_288._8_8_;
            }
            else {
              local_348._0_8_ = local_298._M_allocated_capacity;
            }
            local_348._16_8_ = local_288._0_8_;
            local_348._8_8_ = local_298._8_8_;
            local_298._8_8_ = 0;
            local_288._0_8_ = local_288._0_8_ & 0xffffffffffffff00;
            local_298._M_allocated_capacity = (size_type)(TypeCatalogEntry *)local_288;
            ColumnRefExpression::ColumnRefExpression
                      ((ColumnRefExpression *)_Var32._M_head_impl,(string *)local_348);
            if ((ColumnRefExpression *)local_348._0_8_ != (ColumnRefExpression *)(local_348 + 0x10))
            {
              operator_delete((void *)local_348._0_8_);
            }
            _Var5._M_head_impl =
                 (puVar47->
                 super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                 .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
            (puVar47->
            super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            )._M_t.
            super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
            .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
                 _Var32._M_head_impl;
            if (_Var5._M_head_impl != (ParsedExpression *)0x0) {
              (**(code **)(*(long *)&(_Var5._M_head_impl)->super_BaseExpression + 8))();
            }
            if ((TypeCatalogEntry *)local_298._M_allocated_capacity != (TypeCatalogEntry *)local_288
               ) {
              operator_delete((void *)local_298._M_allocated_capacity);
            }
            puVar47 = puVar47 + 1;
          } while ((CatalogEntry *)puVar47 != local_2a8);
        }
        pCVar39 = (CatalogEntry *)&((Value *)&(local_350._M_head_impl)->column_name_alias)->value_;
      } while (pCVar39 != (CatalogEntry *)local_218[0]);
    }
    puVar47 = (local_300->aggregates).
              super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar53 = (local_300->aggregates).
              super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar47 != puVar53) {
      uVar59 = 0;
      do {
        uVar59 = uVar59 + 1;
        cVar57 = '\x01';
        if (9 < uVar59) {
          uVar50 = uVar59;
          cVar19 = '\x04';
          do {
            cVar57 = cVar19;
            if (uVar50 < 100) {
              cVar57 = cVar57 + -2;
              goto LAB_00707f92;
            }
            if (uVar50 < 1000) {
              cVar57 = cVar57 + -1;
              goto LAB_00707f92;
            }
            if (uVar50 < 10000) goto LAB_00707f92;
            bVar20 = 99999 < uVar50;
            uVar50 = uVar50 / 10000;
            cVar19 = cVar57 + '\x04';
          } while (bVar20);
          cVar57 = cVar57 + '\x01';
        }
LAB_00707f92:
        local_2f8 = (undefined1  [8])&local_2e8;
        ::std::__cxx11::string::_M_construct((ulong)local_2f8,cVar57);
        ::std::__detail::__to_chars_10_impl<unsigned_long>
                  ((char *)local_2f8,(uint)peStack_2f0,uVar59);
        puVar29 = (undefined8 *)
                  ::std::__cxx11::string::replace((ulong)local_2f8,0,(char *)0x0,0x1361349);
        pCVar49 = (ColumnRefExpression *)(puVar29 + 2);
        if ((ColumnRefExpression *)*puVar29 == pCVar49) {
          local_348._16_8_ =
               (pCVar49->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression;
          local_348._24_8_ = puVar29[3];
          local_348._0_8_ = (ColumnRefExpression *)(local_348 + 0x10);
        }
        else {
          local_348._16_8_ =
               (pCVar49->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression;
          local_348._0_8_ = (ColumnRefExpression *)*puVar29;
        }
        local_348._8_8_ = puVar29[1];
        *puVar29 = pCVar49;
        puVar29[1] = 0;
        *(undefined1 *)(puVar29 + 2) = 0;
        if (local_2f8 != (undefined1  [8])&local_2e8) {
          operator_delete((void *)local_2f8);
        }
        pPVar22 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator->(puVar47);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_248.hugeint,&(pPVar22->super_BaseExpression).alias);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&vStack_230,(value_type *)local_348);
        pPVar22 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator->(puVar47);
        ::std::__cxx11::string::operator=
                  ((string *)&(pPVar22->super_BaseExpression).alias,(string *)local_348);
        pSVar28 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
                  operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                              *)&local_2b8);
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    *)&pSVar28->select_list,puVar47);
        if ((ColumnRefExpression *)local_348._0_8_ != (ColumnRefExpression *)(local_348 + 0x10)) {
          operator_delete((void *)local_348._0_8_);
        }
        puVar47 = puVar47 + 1;
      } while (puVar47 != puVar53);
    }
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ::~vector(&local_158);
    _Var16._M_head_impl = local_2b8._M_head_impl;
    local_2b8._M_head_impl = (SelectNode *)0x0;
    pSVar33 = (SelectNode *)operator_new(0xf0);
    SelectNode::SelectNode(pSVar33);
    local_2a0._M_head_impl = (QueryNode *)pSVar33;
    local_1f8.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x80);
    *(undefined1 *)
     &(((TypeCatalogEntry *)
       local_1f8.
       super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->super_StandardEntry).super_InCatalogEntry.
      super_CatalogEntry.oid = 1;
    *(undefined8 *)
     &(((TypeCatalogEntry *)
       local_1f8.
       super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->super_StandardEntry).super_InCatalogEntry.
      super_CatalogEntry.type = 0;
    (((TypeCatalogEntry *)
     local_1f8.
     super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
     ._M_impl.super__Vector_impl_data._M_start)->super_StandardEntry).super_InCatalogEntry.
    super_CatalogEntry.set.ptr = (CatalogSet *)0x0;
    (((TypeCatalogEntry *)
     local_1f8.
     super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
     ._M_impl.super__Vector_impl_data._M_start)->super_StandardEntry).super_InCatalogEntry.
    super_CatalogEntry.name._M_dataplus._M_p =
         (pointer)&(((TypeCatalogEntry *)
                    local_1f8.
                    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->super_StandardEntry).
                   super_InCatalogEntry.super_CatalogEntry.comment;
    (((TypeCatalogEntry *)
     local_1f8.
     super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
     ._M_impl.super__Vector_impl_data._M_start)->super_StandardEntry).super_InCatalogEntry.
    super_CatalogEntry.name._M_string_length = 1;
    (((TypeCatalogEntry *)
     local_1f8.
     super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
     ._M_impl.super__Vector_impl_data._M_start)->super_StandardEntry).super_InCatalogEntry.
    super_CatalogEntry.name.field_2._M_allocated_capacity = 0;
    *(undefined8 *)
     ((long)&(((TypeCatalogEntry *)
              local_1f8.
              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->super_StandardEntry).super_InCatalogEntry.
             super_CatalogEntry.name.field_2 + 8) = 0;
    (((TypeCatalogEntry *)
     local_1f8.
     super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
     ._M_impl.super__Vector_impl_data._M_start)->super_StandardEntry).super_InCatalogEntry.
    super_CatalogEntry.deleted = false;
    (((TypeCatalogEntry *)
     local_1f8.
     super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
     ._M_impl.super__Vector_impl_data._M_start)->super_StandardEntry).super_InCatalogEntry.
    super_CatalogEntry.temporary = false;
    (((TypeCatalogEntry *)
     local_1f8.
     super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
     ._M_impl.super__Vector_impl_data._M_start)->super_StandardEntry).super_InCatalogEntry.
    super_CatalogEntry.internal = true;
    (((TypeCatalogEntry *)
     local_1f8.
     super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
     ._M_impl.super__Vector_impl_data._M_start)->super_StandardEntry).super_InCatalogEntry.
    super_CatalogEntry.field_0x43 = 0x3f;
    (((TypeCatalogEntry *)
     local_1f8.
     super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
     ._M_impl.super__Vector_impl_data._M_start)->super_StandardEntry).super_InCatalogEntry.
    super_CatalogEntry.timestamp.super___atomic_base<unsigned_long>._M_i = 0;
    pIVar12 = &(((TypeCatalogEntry *)
                local_1f8.
                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->super_StandardEntry).
               super_InCatalogEntry;
    (pIVar12->super_CatalogEntry).comment.type_.id_ = INVALID;
    (pIVar12->super_CatalogEntry).comment.type_.physical_type_ = ~INVALID;
    *(undefined6 *)&(pIVar12->super_CatalogEntry).comment.type_.field_0x2 = 0;
    (((TypeCatalogEntry *)
     local_1f8.
     super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
     ._M_impl.super__Vector_impl_data._M_start)->super_StandardEntry).super_InCatalogEntry.
    super_CatalogEntry.comment.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         &(((TypeCatalogEntry *)
           local_1f8.
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->super_StandardEntry).super_InCatalogEntry.
          super_CatalogEntry.comment.is_null;
    (((TypeCatalogEntry *)
     local_1f8.
     super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
     ._M_impl.super__Vector_impl_data._M_start)->super_StandardEntry).super_InCatalogEntry.
    super_CatalogEntry.comment.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (((TypeCatalogEntry *)
     local_1f8.
     super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
     ._M_impl.super__Vector_impl_data._M_start)->super_StandardEntry).super_InCatalogEntry.
    super_CatalogEntry.comment.is_null = false;
    local_218[0] = &PTR__SelectStatement_01981db8;
    (((TypeCatalogEntry *)
     local_1f8.
     super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
     ._M_impl.super__Vector_impl_data._M_start)->super_StandardEntry).super_InCatalogEntry.
    super_CatalogEntry._vptr_CatalogEntry = (_func_int **)&PTR__SelectStatement_01981db8;
    (((TypeCatalogEntry *)
     local_1f8.
     super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
     ._M_impl.super__Vector_impl_data._M_start)->super_StandardEntry).super_InCatalogEntry.
    super_CatalogEntry.comment.value_.hugeint.upper = 0;
    pSVar34 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
              ::operator->((unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                            *)&local_1f8);
    _Var6._M_head_impl =
         (pSVar34->node).
         super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
    (pSVar34->node).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
    _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl =
         &(_Var16._M_head_impl)->super_QueryNode;
    if (_Var6._M_head_impl != (QueryNode *)0x0) {
      (**(code **)((long)(_Var6._M_head_impl)->_vptr_QueryNode + 8))();
    }
    local_350._M_head_impl = (TableRef *)operator_new(0x70);
    local_2f8 = (undefined1  [8])
                local_1f8.
                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_1f8.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_348._8_8_ = (element_type *)0x0;
    local_348._16_8_ = local_348._16_8_ & 0xffffffffffffff00;
    local_348._0_8_ = (ColumnRefExpression *)(local_348 + 0x10);
    SubqueryRef::SubqueryRef
              ((SubqueryRef *)local_350._M_head_impl,
               (unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                *)local_2f8,(string *)local_348);
    if ((ColumnRefExpression *)local_348._0_8_ != (ColumnRefExpression *)(local_348 + 0x10)) {
      operator_delete((void *)local_348._0_8_);
    }
    if (local_2f8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_2f8 + 8))();
    }
    if (local_278._8_8_ != local_278._0_8_) {
      sVar55 = 0;
      do {
        pSVar28 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
                  operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                              *)&local_2a0);
        pSVar30 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
                  operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                              *)&local_2a0);
        Value::INTEGER((Value *)local_2f8,
                       (int)((ulong)((long)(pSVar30->select_list).
                                           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                           .
                                           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(pSVar30->select_list).
                                          super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                          .
                                          super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 3) + 1);
        pCVar31 = (ConstantExpression *)operator_new(0x78);
        Value::Value((Value *)local_348,(Value *)local_2f8);
        ConstantExpression::ConstantExpression(pCVar31,(Value *)local_348);
        Value::~Value((Value *)local_348);
        local_298._M_allocated_capacity = (size_type)pCVar31;
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    *)&pSVar28->groups,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&local_298._M_allocated_capacity);
        if ((ConstantExpression *)local_298._M_allocated_capacity != (ConstantExpression *)0x0) {
          (**(code **)(*(long *)local_298._M_allocated_capacity + 8))();
        }
        local_298._M_allocated_capacity = 0;
        Value::~Value((Value *)local_2f8);
        pvVar35 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                *)local_278,sVar55);
        pTVar36 = (TypeCatalogEntry *)operator_new(0x50);
        local_348._0_8_ = local_348 + 0x10;
        pcVar4 = (pvVar35->_M_dataplus)._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_348,pcVar4,pcVar4 + pvVar35->_M_string_length);
        ColumnRefExpression::ColumnRefExpression((ColumnRefExpression *)pTVar36,(string *)local_348)
        ;
        local_2f8 = (undefined1  [8])pTVar36;
        if ((undefined1 *)local_348._0_8_ != local_348 + 0x10) {
          operator_delete((void *)local_348._0_8_);
        }
        pCVar37 = unique_ptr<duckdb::ColumnRefExpression,_std::default_delete<duckdb::ColumnRefExpression>,_true>
                  ::operator->((unique_ptr<duckdb::ColumnRefExpression,_std::default_delete<duckdb::ColumnRefExpression>,_true>
                                *)local_2f8);
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      *)local_278,sVar55);
        ::std::__cxx11::string::_M_assign
                  ((string *)&(pCVar37->super_ParsedExpression).super_BaseExpression.alias);
        pSVar28 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
                  operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                              *)&local_2a0);
        local_348._0_8_ = local_2f8;
        local_2f8 = (undefined1  [8])0x0;
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    *)&pSVar28->select_list,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)local_348);
        if ((ColumnRefExpression *)local_348._0_8_ != (ColumnRefExpression *)0x0) {
          (**(code **)(*(long *)local_348._0_8_ + 8))();
        }
        if (local_2f8 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_2f8 + 8))();
        }
        sVar55 = sVar55 + 1;
      } while (sVar55 < (ulong)((long)(local_278._8_8_ - local_278._0_8_) >> 5));
    }
    if (vStack_230.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        vStack_230.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      sVar55 = 0;
      do {
        pvVar35 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::operator[](&vStack_230,sVar55);
        pTVar36 = (TypeCatalogEntry *)operator_new(0x50);
        local_348._0_8_ = local_348 + 0x10;
        pcVar4 = (pvVar35->_M_dataplus)._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_348,pcVar4,pcVar4 + pvVar35->_M_string_length);
        ColumnRefExpression::ColumnRefExpression((ColumnRefExpression *)pTVar36,(string *)local_348)
        ;
        if ((undefined1 *)local_348._0_8_ != local_348 + 0x10) {
          operator_delete((void *)local_348._0_8_);
        }
        local_348._0_8_ = (ColumnRefExpression *)0x0;
        local_348._8_8_ = (element_type *)0x0;
        local_348._16_8_ = 0;
        local_2f8 = (undefined1  [8])pTVar36;
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    *)local_348,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)local_2f8);
        if (local_2f8 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_2f8 + 8))();
        }
        make_uniq<duckdb::FunctionExpression,char_const(&)[5],duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
                  ((duckdb *)local_2f8,(char (*) [5])0x138bc09,
                   (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                    *)local_348);
        pFVar38 = unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                  ::operator->((unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                                *)local_2f8);
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ::operator[](&vStack_230,sVar55);
        ::std::__cxx11::string::_M_assign
                  ((string *)&(pFVar38->super_ParsedExpression).super_BaseExpression.alias);
        pSVar28 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
                  operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                              *)&local_2a0);
        local_298._M_allocated_capacity = (size_type)local_2f8;
        local_2f8 = (undefined1  [8])0x0;
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    *)&pSVar28->select_list,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&local_298._M_allocated_capacity);
        if ((TypeCatalogEntry *)local_298._M_allocated_capacity != (TypeCatalogEntry *)0x0) {
          (**(code **)(*(long *)local_298._M_allocated_capacity + 8))();
        }
        if (local_2f8 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_2f8 + 8))();
        }
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   *)local_348);
        sVar55 = sVar55 + 1;
      } while (sVar55 < (ulong)((long)vStack_230.
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)vStack_230.
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    local_360._M_head_impl = (ParsedExpression *)0x0;
    pCVar39 = (CatalogEntry *)
              (local_300->pivots).
              super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
              super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_2a8 = (CatalogEntry *)
                (local_300->pivots).
                super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
                super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    if (pCVar39 != local_2a8) {
      do {
        puVar1 = (pointer)pCVar39->oid;
        local_358 = pCVar39;
        for (puVar54 = (pointer)((TableRef *)&pCVar39->_vptr_CatalogEntry)->_vptr_TableRef;
            puVar54 != puVar1; puVar54 = puVar54 + 1) {
          local_2b0._M_head_impl =
               (puVar54->
               super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
               )._M_t.
               super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
               .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
          (puVar54->
          super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          )._M_t.
          super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
               (ParsedExpression *)0x0;
          ConstructPivotExpression
                    ((duckdb *)&local_308,
                     (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *)&local_2b0);
          if ((pointer)local_2b0._M_head_impl != (pointer)0x0) {
            (*((local_2b0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
          }
          local_2b0._M_head_impl = (ParsedExpression *)0x0;
          if ((ColumnRefExpression *)local_360._M_head_impl == (ColumnRefExpression *)0x0) {
            local_360._M_head_impl = (ParsedExpression *)local_308.index;
          }
          else {
            local_298._M_allocated_capacity = 0;
            local_298._8_8_ = 0;
            local_288._0_8_ = (__node_base_ptr)0x0;
            ::std::
            vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                        *)local_298._M_local_buf,
                       (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                        *)&local_360);
            Value::Value((Value *)local_2f8,"_");
            pCVar39 = (CatalogEntry *)operator_new(0x78);
            Value::Value((Value *)local_348,(Value *)local_2f8);
            ConstantExpression::ConstantExpression((ConstantExpression *)pCVar39,(Value *)local_348)
            ;
            Value::~Value((Value *)local_348);
            local_200._M_head_impl = pCVar39;
            ::std::
            vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                        *)local_298._M_local_buf,
                       (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                        *)&local_200);
            if (local_200._M_head_impl != (CatalogEntry *)0x0) {
              (*(((ParsedExpression *)&(local_200._M_head_impl)->_vptr_CatalogEntry)->
                super_BaseExpression)._vptr_BaseExpression[1])();
            }
            local_200._M_head_impl = (CatalogEntry *)0x0;
            Value::~Value((Value *)local_2f8);
            ::std::
            vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                        *)local_298._M_local_buf,
                       (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                        *)&local_308);
            make_uniq<duckdb::FunctionExpression,char_const(&)[7],duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
                      ((duckdb *)local_348,(char (*) [7])0x1393241,
                       (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                        *)&local_298);
            uVar14 = local_348._0_8_;
            _Var32._M_head_impl = local_360._M_head_impl;
            local_348._0_8_ = (ColumnRefExpression *)0x0;
            local_360._M_head_impl = (ParsedExpression *)uVar14;
            if (((ColumnRefExpression *)_Var32._M_head_impl != (ColumnRefExpression *)0x0) &&
               ((*((BaseExpression *)
                  &((_Var32._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)->
                  _vptr_BaseExpression[1])(),
               (ColumnRefExpression *)local_348._0_8_ != (ColumnRefExpression *)0x0)) {
              (**(code **)(*(long *)local_348._0_8_ + 8))();
            }
            ::std::
            vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       *)&local_298);
            if ((ColumnRefExpression *)local_308.index != (ColumnRefExpression *)0x0) {
              (**(code **)(*(long *)local_308.index + 8))();
            }
          }
        }
        pCVar39 = (CatalogEntry *)&(local_358->comment).value_;
      } while (pCVar39 != local_2a8);
    }
    local_2f8 = (undefined1  [8])0x0;
    peStack_2f0 = (element_type *)0x0;
    local_2e8._M_allocated_capacity = 0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)local_2f8,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&local_360);
    make_uniq<duckdb::FunctionExpression,char_const(&)[5],duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
              ((duckdb *)&local_308,(char (*) [5])0x138bc09,
               (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                *)local_2f8);
    pFVar38 = unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
              ::operator->((unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                            *)&local_308);
    local_298._M_allocated_capacity = 0x15;
    local_348._0_8_ = local_348 + 0x10;
    local_348._0_8_ = ::std::__cxx11::string::_M_create((ulong *)local_348,(ulong)&local_298);
    local_348._16_8_ = local_298._M_allocated_capacity;
    builtin_strncpy((char *)local_348._0_8_,"__internal_pivot_name",0x15);
    local_348._8_8_ = local_298._M_allocated_capacity;
    *(char *)(local_348._0_8_ + local_298._M_allocated_capacity) = '\0';
    ::std::__cxx11::string::operator=
              ((string *)&(pFVar38->super_ParsedExpression).super_BaseExpression.alias,
               (string *)local_348);
    if ((undefined1 *)local_348._0_8_ != local_348 + 0x10) {
      operator_delete((void *)local_348._0_8_);
    }
    pSVar28 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
              operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                          *)&local_2a0);
    local_348._0_8_ = local_308.index;
    local_308.index = 0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&pSVar28->select_list,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)local_348);
    if ((ColumnRefExpression *)local_348._0_8_ != (ColumnRefExpression *)0x0) {
      (**(code **)(*(long *)local_348._0_8_ + 8))();
    }
    pSVar28 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
              operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                          *)&local_2a0);
    _Var40._M_head_impl =
         (pSVar28->from_table).
         super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
         super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
    (pSVar28->from_table).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>
    ._M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
    super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = local_350._M_head_impl;
    if (_Var40._M_head_impl != (TableRef *)0x0) {
      (**(code **)((long)(_Var40._M_head_impl)->_vptr_TableRef + 8))();
    }
    if ((ColumnRefExpression *)local_308.index != (ColumnRefExpression *)0x0) {
      (**(code **)(*(long *)local_308.index + 8))();
    }
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               *)local_2f8);
    if ((ColumnRefExpression *)local_360._M_head_impl != (ColumnRefExpression *)0x0) {
      (*((BaseExpression *)&((local_360._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)->
        _vptr_BaseExpression[1])();
    }
    if (local_1f8.
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)&((((local_1f8.
                       super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                     )._M_t.
                     super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                     .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl)->
                   super_BaseExpression).type)();
    }
    _Var17._M_head_impl = local_2a0._M_head_impl;
    local_2a0._M_head_impl = (QueryNode *)0x0;
    local_198.
    super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_1d8.
         super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_198.
    super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_1d8.
         super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_198.
    super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_1d8.
         super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_1d8.
    super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d8.
    super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1d8.
    super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pSVar33 = (SelectNode *)operator_new(0xf0);
    SelectNode::SelectNode(pSVar33);
    local_360._M_head_impl = (ParsedExpression *)pSVar33;
    local_298._M_allocated_capacity = (size_type)operator_new(0x80);
    *(undefined1 *)
     &(((TypeCatalogEntry *)local_298._M_allocated_capacity)->super_StandardEntry).
      super_InCatalogEntry.super_CatalogEntry.oid = 1;
    *(undefined8 *)
     &(((TypeCatalogEntry *)local_298._M_allocated_capacity)->super_StandardEntry).
      super_InCatalogEntry.super_CatalogEntry.type = 0;
    (((TypeCatalogEntry *)local_298._M_allocated_capacity)->super_StandardEntry).
    super_InCatalogEntry.super_CatalogEntry.set.ptr = (CatalogSet *)0x0;
    (((TypeCatalogEntry *)local_298._M_allocated_capacity)->super_StandardEntry).
    super_InCatalogEntry.super_CatalogEntry.name._M_dataplus._M_p =
         (pointer)&(((TypeCatalogEntry *)local_298._M_allocated_capacity)->super_StandardEntry).
                   super_InCatalogEntry.super_CatalogEntry.comment;
    (((TypeCatalogEntry *)local_298._M_allocated_capacity)->super_StandardEntry).
    super_InCatalogEntry.super_CatalogEntry.name._M_string_length = 1;
    (((TypeCatalogEntry *)local_298._M_allocated_capacity)->super_StandardEntry).
    super_InCatalogEntry.super_CatalogEntry.name.field_2._M_allocated_capacity = 0;
    *(undefined8 *)
     ((long)&(((TypeCatalogEntry *)local_298._M_allocated_capacity)->super_StandardEntry).
             super_InCatalogEntry.super_CatalogEntry.name.field_2 + 8) = 0;
    (((TypeCatalogEntry *)local_298._M_allocated_capacity)->super_StandardEntry).
    super_InCatalogEntry.super_CatalogEntry.deleted = false;
    (((TypeCatalogEntry *)local_298._M_allocated_capacity)->super_StandardEntry).
    super_InCatalogEntry.super_CatalogEntry.temporary = false;
    (((TypeCatalogEntry *)local_298._M_allocated_capacity)->super_StandardEntry).
    super_InCatalogEntry.super_CatalogEntry.internal = true;
    (((TypeCatalogEntry *)local_298._M_allocated_capacity)->super_StandardEntry).
    super_InCatalogEntry.super_CatalogEntry.field_0x43 = 0x3f;
    (((TypeCatalogEntry *)local_298._M_allocated_capacity)->super_StandardEntry).
    super_InCatalogEntry.super_CatalogEntry.timestamp.super___atomic_base<unsigned_long>._M_i = 0;
    pIVar12 = &(((TypeCatalogEntry *)local_298._M_allocated_capacity)->super_StandardEntry).
               super_InCatalogEntry;
    (pIVar12->super_CatalogEntry).comment.type_.id_ = INVALID;
    (pIVar12->super_CatalogEntry).comment.type_.physical_type_ = ~INVALID;
    *(undefined6 *)&(pIVar12->super_CatalogEntry).comment.type_.field_0x2 = 0;
    (((TypeCatalogEntry *)local_298._M_allocated_capacity)->super_StandardEntry).
    super_InCatalogEntry.super_CatalogEntry.comment.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         &(((TypeCatalogEntry *)local_298._M_allocated_capacity)->super_StandardEntry).
          super_InCatalogEntry.super_CatalogEntry.comment.is_null;
    (((TypeCatalogEntry *)local_298._M_allocated_capacity)->super_StandardEntry).
    super_InCatalogEntry.super_CatalogEntry.comment.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (((TypeCatalogEntry *)local_298._M_allocated_capacity)->super_StandardEntry).
    super_InCatalogEntry.super_CatalogEntry.comment.is_null = false;
    (((TypeCatalogEntry *)local_298._M_allocated_capacity)->super_StandardEntry).
    super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry = (_func_int **)local_218[0];
    (((TypeCatalogEntry *)local_298._M_allocated_capacity)->super_StandardEntry).
    super_InCatalogEntry.super_CatalogEntry.comment.value_.hugeint.upper = 0;
    pSVar34 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
              ::operator->((unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                            *)&local_298._M_allocated_capacity);
    _Var6._M_head_impl =
         (pSVar34->node).
         super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
    (pSVar34->node).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
    _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = _Var17._M_head_impl;
    if (_Var6._M_head_impl != (QueryNode *)0x0) {
      (**(code **)((long)(_Var6._M_head_impl)->_vptr_QueryNode + 8))();
    }
    _Var40._M_head_impl = (TableRef *)operator_new(0x70);
    local_2f8 = (undefined1  [8])local_298._M_allocated_capacity;
    local_298._M_allocated_capacity = 0;
    local_348._8_8_ = (element_type *)0x0;
    local_348._16_8_ = local_348._16_8_ & 0xffffffffffffff00;
    local_348._0_8_ = local_348 + 0x10;
    SubqueryRef::SubqueryRef
              ((SubqueryRef *)_Var40._M_head_impl,
               (unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                *)local_2f8,(string *)local_348);
    if ((undefined1 *)local_348._0_8_ != local_348 + 0x10) {
      operator_delete((void *)local_348._0_8_);
    }
    if (local_2f8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_2f8 + 8))();
    }
    local_2f8 = (undefined1  [8])operator_new(0x120);
    *(TableReferenceType *)
     &(((TypeCatalogEntry *)local_2f8)->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry
      .oid = PIVOT;
    (((string *)
     &(((TypeCatalogEntry *)local_2f8)->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry
      .type)->_M_dataplus)._M_p =
         (pointer)&(((TypeCatalogEntry *)local_2f8)->super_StandardEntry).super_InCatalogEntry.
                   super_CatalogEntry.name;
    (((TypeCatalogEntry *)local_2f8)->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
    set.ptr = (CatalogSet *)0x0;
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)&(((TypeCatalogEntry *)local_2f8)->super_StandardEntry).super_InCatalogEntry.
         super_CatalogEntry.name)->_M_local_buf[0] = '\0';
    pIVar12 = &(((TypeCatalogEntry *)local_2f8)->super_StandardEntry).super_InCatalogEntry;
    *(char *)&(pIVar12->super_CatalogEntry).name.field_2 = '\0';
    *(char *)((long)&(pIVar12->super_CatalogEntry).name.field_2 + 1) = '\0';
    *(char *)((long)&(pIVar12->super_CatalogEntry).name.field_2 + 2) = '\0';
    *(char *)((long)&(pIVar12->super_CatalogEntry).name.field_2 + 3) = '\0';
    *(char *)((long)&(pIVar12->super_CatalogEntry).name.field_2 + 4) = '\0';
    *(char *)((long)&(pIVar12->super_CatalogEntry).name.field_2 + 5) = '\0';
    *(char *)((long)&(pIVar12->super_CatalogEntry).name.field_2 + 6) = '\0';
    *(char *)((long)&(pIVar12->super_CatalogEntry).name.field_2 + 7) = '\0';
    pIVar12 = &(((TypeCatalogEntry *)local_2f8)->super_StandardEntry).super_InCatalogEntry;
    *(char *)((long)&(pIVar12->super_CatalogEntry).name.field_2 + 8) = -1;
    *(char *)((long)&(pIVar12->super_CatalogEntry).name.field_2 + 9) = -1;
    *(char *)((long)&(pIVar12->super_CatalogEntry).name.field_2 + 10) = -1;
    *(char *)((long)&(pIVar12->super_CatalogEntry).name.field_2 + 0xb) = -1;
    *(char *)((long)&(pIVar12->super_CatalogEntry).name.field_2 + 0xc) = -1;
    *(char *)((long)&(pIVar12->super_CatalogEntry).name.field_2 + 0xd) = -1;
    *(char *)((long)&(pIVar12->super_CatalogEntry).name.field_2 + 0xe) = -1;
    *(char *)((long)&(pIVar12->super_CatalogEntry).name.field_2 + 0xf) = -1;
    (((shared_ptr<duckdb::ExternalDependency,_true> *)
     &(((TypeCatalogEntry *)local_2f8)->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry
      .deleted)->internal).
    super___shared_ptr<duckdb::ExternalDependency,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
    &(((TypeCatalogEntry *)local_2f8)->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
     timestamp)->_M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pIVar12 = &(((TypeCatalogEntry *)local_2f8)->super_StandardEntry).super_InCatalogEntry;
    (pIVar12->super_CatalogEntry).comment.type_.id_ = INVALID;
    (pIVar12->super_CatalogEntry).comment.type_.physical_type_ = ~INVALID;
    *(undefined6 *)&(pIVar12->super_CatalogEntry).comment.type_.field_0x2 = 0;
    (((TypeCatalogEntry *)local_2f8)->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
    comment.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (((TypeCatalogEntry *)local_2f8)->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
    comment.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (((TypeCatalogEntry *)local_2f8)->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
    _vptr_CatalogEntry = (_func_int **)&PTR__PivotRef_01982490;
    *(undefined8 *)
     &(((TypeCatalogEntry *)local_2f8)->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry
      .comment.is_null = 0;
    (((TypeCatalogEntry *)local_2f8)->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
    comment.value_.bigint = 0;
    *(undefined8 *)
     ((long)&(((TypeCatalogEntry *)local_2f8)->super_StandardEntry).super_InCatalogEntry.
             super_CatalogEntry.comment.value_ + 8) = 0;
    (((TypeCatalogEntry *)local_2f8)->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
    comment.value_info_.internal.
    super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (((TypeCatalogEntry *)local_2f8)->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
    comment.value_info_.internal.
    super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (((TypeCatalogEntry *)local_2f8)->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
    tags._M_h._M_buckets = (__buckets_ptr)0x0;
    (((TypeCatalogEntry *)local_2f8)->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
    tags._M_h._M_bucket_count = 0;
    (((TypeCatalogEntry *)local_2f8)->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
    tags._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (((TypeCatalogEntry *)local_2f8)->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
    tags._M_h._M_element_count = 0;
    *(undefined8 *)
     &(((TypeCatalogEntry *)local_2f8)->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry
      .tags._M_h._M_rehash_policy = 0;
    (((TypeCatalogEntry *)local_2f8)->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
    tags._M_h._M_rehash_policy._M_next_resize = 0;
    (((TypeCatalogEntry *)local_2f8)->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
    tags._M_h._M_single_bucket = (__node_base_ptr)0x0;
    *(undefined8 *)
     ((long)&(((TypeCatalogEntry *)local_2f8)->super_StandardEntry).super_InCatalogEntry.
             super_CatalogEntry.tags._M_h._M_single_bucket + 1) = 0;
    *(undefined8 *)
     ((long)&(((TypeCatalogEntry *)local_2f8)->super_StandardEntry).super_InCatalogEntry.
             super_CatalogEntry.child.
             super_unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>._M_t
             .
             super___uniq_ptr_impl<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>
             .super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl + 1) = 0;
    (((TypeCatalogEntry *)local_2f8)->super_StandardEntry).super_InCatalogEntry.catalog =
         (Catalog *)0x0;
    (((TypeCatalogEntry *)local_2f8)->super_StandardEntry).schema = (SchemaCatalogEntry *)0x0;
    (((TypeCatalogEntry *)local_2f8)->super_StandardEntry).dependencies.set._M_h._M_buckets =
         (__buckets_ptr)0x0;
    (((TypeCatalogEntry *)local_2f8)->super_StandardEntry).dependencies.set._M_h._M_bucket_count = 0
    ;
    (((TypeCatalogEntry *)local_2f8)->super_StandardEntry).dependencies.set._M_h._M_before_begin.
    _M_nxt = (_Hash_node_base *)0x0;
    (((TypeCatalogEntry *)local_2f8)->super_StandardEntry).dependencies.set._M_h._M_element_count =
         0;
    *(undefined8 *)
     &(((TypeCatalogEntry *)local_2f8)->super_StandardEntry).dependencies.set._M_h._M_rehash_policy
         = 0;
    (((TypeCatalogEntry *)local_2f8)->super_StandardEntry).dependencies.set._M_h._M_rehash_policy.
    _M_next_resize = 0;
    (((TypeCatalogEntry *)local_2f8)->super_StandardEntry).dependencies.set._M_h._M_single_bucket =
         (__node_base_ptr)0x0;
    pPVar41 = unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>::operator->
                        ((unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>
                          *)local_2f8);
    local_348._16_8_ =
         (pPVar41->bound_pivot_values).
         super_vector<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
         super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    (pPVar41->bound_pivot_values).
    super_vector<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
    super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_198.
         super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_348._0_8_ =
         (pPVar41->bound_pivot_values).
         super_vector<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
         super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_348._8_8_ =
         (pPVar41->bound_pivot_values).
         super_vector<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
         super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    (pPVar41->bound_pivot_values).
    super_vector<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
    super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_198.
         super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
         _M_impl.super__Vector_impl_data._M_start;
    (pPVar41->bound_pivot_values).
    super_vector<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
    super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_198.
         super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_198.
    super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_198.
    super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_198.
    super__Vector_base<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::vector<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>::~vector
              ((vector<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_> *)
               local_348);
    pPVar41 = unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>::operator->
                        ((unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>
                          *)local_2f8);
    local_348._16_8_ =
         (pPVar41->bound_group_names).
         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (pPVar41->bound_group_names).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_258._8_8_;
    local_348._0_8_ =
         (pPVar41->bound_group_names).
         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_348._8_8_ =
         (pPVar41->bound_group_names).
         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (pPVar41->bound_group_names).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)auStack_260;
    (pPVar41->bound_group_names).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_258._0_8_;
    auStack_260 = (undefined1  [8])0x0;
    local_258._0_8_ = 0;
    local_258._8_8_ = 0;
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_348);
    pPVar41 = unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>::operator->
                        ((unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>
                          *)local_2f8);
    local_348._16_8_ =
         (pPVar41->bound_aggregate_names).
         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (pPVar41->bound_aggregate_names).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = local_238;
    local_348._0_8_ =
         (pPVar41->bound_aggregate_names).
         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_348._8_8_ =
         (pPVar41->bound_aggregate_names).
         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (pPVar41->bound_aggregate_names).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_248.bigint;
    (pPVar41->bound_aggregate_names).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_248.hugeint.upper;
    local_248.bigint = 0;
    local_248.hugeint.upper = 0;
    local_238 = (pointer)0x0;
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_348);
    pPVar41 = unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>::operator->
                        ((unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>
                          *)local_2f8);
    _Var7._M_head_impl =
         (pPVar41->source).
         super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
         super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
    (pPVar41->source).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>.
    _M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
    super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = _Var40._M_head_impl;
    if (_Var7._M_head_impl != (TableRef *)0x0) {
      (**(code **)((long)(_Var7._M_head_impl)->_vptr_TableRef + 8))();
    }
    pSVar28 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
              operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                          *)&local_360);
    this_00 = (StarExpression *)operator_new(0x110);
    local_348._8_8_ = (element_type *)0x0;
    local_348._16_8_ = local_348._16_8_ & 0xffffffffffffff00;
    local_348._0_8_ = (ColumnRefExpression *)(local_348 + 0x10);
    StarExpression::StarExpression(this_00,(string *)local_348);
    if ((ColumnRefExpression *)local_348._0_8_ != (ColumnRefExpression *)(local_348 + 0x10)) {
      operator_delete((void *)local_348._0_8_);
    }
    local_1f8.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)this_00;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&pSVar28->select_list,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&local_1f8);
    if ((StarExpression *)
        local_1f8.
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (StarExpression *)0x0) {
      (*(((ParsedExpression *)
         &(local_1f8.
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->
          super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         )->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    auVar15 = local_2f8;
    local_2f8 = (undefined1  [8])0x0;
    pSVar28 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
              operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                          *)&local_360);
    _Var40._M_head_impl =
         (pSVar28->from_table).
         super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
         super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
    (pSVar28->from_table).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>
    ._M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
    super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = (TableRef *)auVar15;
    if (_Var40._M_head_impl != (TableRef *)0x0) {
      (**(code **)((long)(_Var40._M_head_impl)->_vptr_TableRef + 8))();
    }
    if (local_2f8 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_2f8 + 8))();
    }
    if ((long *)local_298._M_allocated_capacity != (long *)0x0) {
      (**(code **)(*(long *)local_298._M_allocated_capacity + 8))();
    }
    _Var32._M_head_impl = local_360._M_head_impl;
    local_360._M_head_impl = (ParsedExpression *)0x0;
    plVar45 = (long *)*local_218[1];
    *local_218[1] = (undefined *)_Var32._M_head_impl;
    if ((plVar45 != (long *)0x0) &&
       ((**(code **)(*plVar45 + 8))(), local_360._M_head_impl != (ParsedExpression *)0x0)) {
      (*((local_360._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_360._M_head_impl = (ParsedExpression *)0x0;
    ::std::vector<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>::~vector
              (&local_198);
    if (local_2a0._M_head_impl != (QueryNode *)0x0) {
      (*(local_2a0._M_head_impl)->_vptr_QueryNode[1])();
    }
    if (local_2b8._M_head_impl != (SelectNode *)0x0) {
      (*((local_2b8._M_head_impl)->super_QueryNode)._vptr_QueryNode[1])();
    }
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&vStack_230);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_248.hugeint);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_268 + 8));
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_278);
  }
  ::std::vector<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>::~vector
            (&local_1d8);
  if ((CatalogEntry *)
      local_1b8.
      super_vector<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (CatalogEntry *)0x0) {
    operator_delete(local_1b8.
                    super_vector<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
                    .
                    super__Vector_base<std::reference_wrapper<duckdb::FunctionExpression>,_std::allocator<std::reference_wrapper<duckdb::FunctionExpression>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_d8);
  return (unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>_>)
         (__uniq_ptr_impl<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>_>)local_218[1]
  ;
}

Assistant:

unique_ptr<SelectNode> Binder::BindPivot(PivotRef &ref, vector<unique_ptr<ParsedExpression>> all_columns) {
	// keep track of the columns by which we pivot/aggregate
	// any columns which are not pivoted/aggregated on are added to the GROUP BY clause
	case_insensitive_set_t handled_columns;

	vector<reference<FunctionExpression>> pivot_aggregates;
	// parse the aggregate, and extract the referenced columns from the aggregate
	for (auto &aggr : ref.aggregates) {
		if (aggr->HasSubquery()) {
			throw BinderException(*aggr, "Pivot expression cannot contain subqueries");
		}
		if (aggr->IsWindow()) {
			throw BinderException(*aggr, "Pivot expression cannot contain window functions");
		}
		idx_t aggregate_count = pivot_aggregates.size();
		ExtractPivotAggregateExpression(context, *aggr, pivot_aggregates);
		if (pivot_aggregates.size() != aggregate_count + 1) {
			string error_str = pivot_aggregates.size() == aggregate_count
			                       ? "but no aggregates were found"
			                       : "but " + to_string(pivot_aggregates.size() - aggregate_count) + " were found";
			throw BinderException(*aggr, "Pivot expression must contain exactly one aggregate, %s", error_str);
		}
	}
	for (auto &aggr : pivot_aggregates) {
		ExtractPivotExpressions(aggr.get(), handled_columns);
	}

	// first add all pivots to the set of handled columns, and check for duplicates
	idx_t total_pivots = 1;
	for (auto &pivot : ref.pivots) {
		if (!pivot.pivot_enum.empty()) {
			auto &type_entry =
			    Catalog::GetEntry<TypeCatalogEntry>(context, INVALID_CATALOG, INVALID_SCHEMA, pivot.pivot_enum);
			auto type = type_entry.user_type;
			if (type.id() != LogicalTypeId::ENUM) {
				throw BinderException(ref, "Pivot must reference an ENUM type: \"%s\" is of type \"%s\"",
				                      pivot.pivot_enum, type.ToString());
			}
			if (!type.IsComplete()) {
				throw BinderException("ENUM type is incomplete");
			}
			auto enum_size = EnumType::GetSize(type);
			for (idx_t i = 0; i < enum_size; i++) {
				auto enum_value = EnumType::GetValue(Value::ENUM(i, type));
				PivotColumnEntry entry;
				entry.values.emplace_back(enum_value);
				entry.alias = std::move(enum_value);
				pivot.entries.push_back(std::move(entry));
			}
		}
		total_pivots *= pivot.entries.size();
		// add the pivoted column to the columns that have been handled
		for (auto &pivot_name : pivot.pivot_expressions) {
			ExtractPivotExpressions(*pivot_name, handled_columns);
		}
		value_set_t pivots;
		for (auto &entry : pivot.entries) {
			D_ASSERT(!entry.expr);
			Value val;
			if (entry.values.size() == 1) {
				val = entry.values[0];
			} else {
				val = Value::LIST(LogicalType::VARCHAR, entry.values);
			}
			if (pivots.find(val) != pivots.end()) {
				throw BinderException(ref, "The value \"%s\" was specified multiple times in the IN clause",
				                      val.ToString());
			}
			if (entry.values.size() != pivot.pivot_expressions.size()) {
				throw BinderException(ref, "PIVOT IN list - inconsistent amount of rows - expected %d but got %d",
				                      pivot.pivot_expressions.size(), entry.values.size());
			}
			pivots.insert(val);
		}
	}
	auto &client_config = ClientConfig::GetConfig(context);
	auto pivot_limit = client_config.pivot_limit;
	if (total_pivots >= pivot_limit) {
		throw BinderException(ref, "Pivot column limit of %llu exceeded. Use SET pivot_limit=X to increase the limit.",
		                      client_config.pivot_limit);
	}

	// construct the required pivot values recursively
	vector<PivotValueElement> pivot_values;
	ConstructPivots(ref, pivot_values);

	unique_ptr<SelectNode> pivot_node;
	// pivots have three components
	// - the pivots (i.e. future column names)
	// - the groups (i.e. the future row names
	// - the aggregates (i.e. the values of the pivot columns)

	// we have two ways of executing a pivot statement
	// (1) the straightforward manner of filtered aggregates SUM(..) FILTER (pivot_value=X)
	// (2) computing the aggregates once, then using LIST to group the aggregates together with the PIVOT operator
	// -> filtered aggregates are faster when there are FEW pivot values
	// -> LIST is faster when there are MANY pivot values
	// we switch dynamically based on the number of pivots to compute
	if (pivot_values.size() <= client_config.pivot_filter_threshold) {
		// use a set of filtered aggregates
		pivot_node =
		    PivotFilteredAggregate(context, ref, std::move(all_columns), handled_columns, std::move(pivot_values));
	} else {
		// executing a pivot statement happens in three stages
		// 1) execute the query "SELECT {groups}, {pivots}, {aggregates} FROM {from_clause} GROUP BY {groups}, {pivots}
		// this computes all values that are required in the final result, but not yet in the correct orientation
		// 2) execute the query "SELECT {groups}, LIST({pivots}), LIST({aggregates}) FROM [Q1] GROUP BY {groups}
		// this pushes all pivots and aggregates that belong to a specific group together in an aligned manner
		// 3) push a PIVOT operator, that performs the actual pivoting of the values into the different columns

		PivotBindState bind_state;
		// Pivot Stage 1
		// SELECT {groups}, {pivots}, {aggregates} FROM {from_clause} GROUP BY {groups}, {pivots}
		auto subquery_stage1 = PivotInitialAggregate(bind_state, ref, std::move(all_columns), handled_columns);

		// Pivot stage 2
		// SELECT {groups}, LIST({pivots}), LIST({aggregates}) FROM [Q1] GROUP BY {groups}
		auto subquery_stage2 = PivotListAggregate(bind_state, ref, std::move(subquery_stage1));

		// Pivot stage 3
		// construct the final pivot operator
		pivot_node = PivotFinalOperator(bind_state, ref, std::move(subquery_stage2), std::move(pivot_values));
	}
	return pivot_node;
}